

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O3

phits_file_t phits_open_file(char *filename)

{
  int iVar1;
  phits_fileinternal_t *f;
  FILE *pFVar2;
  char *pcVar3;
  
  if (filename == (char *)0x0) {
    pFVar2 = (FILE *)phits_impl_stdout_data::thefh;
    if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
      pFVar2 = _stdout;
    }
    fprintf(pFVar2,"ERROR: %s\n","phits_open_file called with null string for filename");
    exit(1);
  }
  f = (phits_fileinternal_t *)calloc(1,0x110);
  if (f != (phits_fileinternal_t *)0x0) {
    f->reclen = 4;
    mcpl_generic_fopen(f,filename);
    iVar1 = mcpl_generic_fread_try(f,f->buf,1);
    if (iVar1 == 1) {
      f->lbuf = 1;
      iVar1 = phits_tryload_reclen(f,4);
      if (iVar1 == 0) {
        iVar1 = phits_tryload_reclen(f,8);
        if (iVar1 == 0) {
          pFVar2 = (FILE *)phits_impl_stdout_data::thefh;
          if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
            pFVar2 = _stdout;
          }
          if (f->lbuf < 8) {
            pcVar3 = "Invalid PHITS dump file: too short\n";
          }
          else {
            pcVar3 = "Invalid PHITS dump file: Problems reading first record.\n";
          }
          goto LAB_001027ee;
        }
      }
      if (f->reclen == 8) {
        pFVar2 = (FILE *)phits_impl_stdout_data::thefh;
        if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
          pFVar2 = _stdout;
        }
        fwrite("phits_open_file WARNING: 64bit Fortran records detected which is untested (feedback appreciated at https://mctools.github.io/mcpl/contact/).\n"
               ,0x8d,1,pFVar2);
      }
      iVar1 = 0;
      if (f->particlesize != 0x50) {
        if (f->particlesize != 0x68) {
          pFVar2 = (FILE *)phits_impl_stdout_data::thefh;
          if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
            pFVar2 = _stdout;
          }
          pcVar3 = 
          "Invalid PHITS dump file: Does not contain exactly 10 or 13 fields in each particle - like due to unsupported configuration flags being used when producing the file.\n"
          ;
          goto LAB_001027ee;
        }
        iVar1 = 1;
      }
    }
    else {
      f->particlesize = 0;
      iVar1 = 0;
    }
    f->haspolarisation = iVar1;
    return (phits_file_t)f;
  }
  pFVar2 = (FILE *)phits_impl_stdout_data::thefh;
  if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  pcVar3 = "memory allocation failure";
LAB_001027ee:
  fprintf(pFVar2,"ERROR: %s\n",pcVar3);
  exit(1);
}

Assistant:

phits_file_t phits_open_file( const char * filename )
{
  if (!filename)
    phits_error("phits_open_file called with null string for filename");

  //Open, classify and process first record with mcnp type and version info:
  phits_file_t out = phits_open_internal( filename );
  phits_fileinternal_t * f = (phits_fileinternal_t *)out.internal;
  assert(f);

  out.internal = f;
  return out;
}